

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::anon_unknown_0::SeparateProgramsVertex::CreateShaderProgram
          (SeparateProgramsVertex *this,GLenum type,GLsizei count,GLchar **strings)

{
  GLchar local_438 [8];
  GLchar log [1024];
  int local_2c;
  GLint local_28;
  GLsizei length;
  GLint status;
  GLuint program;
  GLchar **strings_local;
  GLsizei count_local;
  GLenum type_local;
  SeparateProgramsVertex *this_local;
  
  _status = strings;
  strings_local._0_4_ = count;
  strings_local._4_4_ = type;
  _count_local = this;
  length = glu::CallLogWrapper::glCreateShaderProgramv
                     (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,type,count,strings);
  local_28 = 1;
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,length,0x8b82,&local_28);
  if ((local_28 == 0) &&
     (glu::CallLogWrapper::glGetProgramInfoLog
                (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,length,0x400,&local_2c,local_438), 1 < local_2c)) {
    anon_unknown_0::Output("Program Info Log:\n%s\n",local_438);
  }
  return length;
}

Assistant:

virtual GLuint CreateShaderProgram(GLenum type, GLsizei count, const GLchar** strings)
	{
		GLuint program = glCreateShaderProgramv(type, count, strings);
		GLint  status  = GL_TRUE;
		glGetProgramiv(program, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLsizei length;
			GLchar  log[1024];
			glGetProgramInfoLog(program, sizeof(log), &length, log);
			if (length > 1)
			{
				Output("Program Info Log:\n%s\n", log);
			}
		}
		return program;
	}